

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O2

EGLConfig eglu::chooseSingleConfig(Library *egl,EGLDisplay display,FilterList *filters)

{
  EGLConfig pvVar1;
  bool bVar2;
  NotSupportedError *this;
  pointer ppvVar3;
  vector<void_*,_std::allocator<void_*>_> allConfigs;
  
  getConfigs(&allConfigs,egl,display);
  ppvVar3 = allConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (ppvVar3 ==
        allConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"No matching EGL config found",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                 ,0x99);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    bVar2 = FilterList::match(filters,egl,display,*ppvVar3);
    if (bVar2) break;
    ppvVar3 = ppvVar3 + 1;
  }
  pvVar1 = *ppvVar3;
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&allConfigs.super__Vector_base<void_*,_std::allocator<void_*>_>);
  return pvVar1;
}

Assistant:

EGLConfig chooseSingleConfig (const Library& egl, EGLDisplay display, const FilterList& filters)
{
	const vector<EGLConfig>	allConfigs	(getConfigs(egl, display));

	for (vector<EGLConfig>::const_iterator cfg = allConfigs.begin(); cfg != allConfigs.end(); ++cfg)
	{
		if (filters.match(egl, display, *cfg))
			return *cfg;
	}

	TCU_THROW(NotSupportedError, "No matching EGL config found");
}